

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

int __thiscall
IlmThread_3_3::anon_unknown_5::DefaultThreadPoolProvider::numThreads
          (DefaultThreadPoolProvider *this)

{
  element_type *peVar1;
  memory_order __b;
  
  peVar1 = std::
           __shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d8ee7);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (peVar1->_threadCount).super___atomic_base<int>._M_i;
}

Assistant:

int
DefaultThreadPoolProvider::numThreads () const
{
    return _data->_threadCount.load ();
}